

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlCharEncOutFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int local_5c;
  int toconv;
  int len;
  xmlCharEncodingHandler *local_50;
  xmlChar charref [20];
  
  if (out == (xmlBufferPtr)0x0 || handler == (xmlCharEncodingHandler *)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = 0;
    local_50 = handler;
    while( true ) {
      uVar4 = (ulong)out->use;
      local_5c = out->size - out->use;
      local_5c = local_5c - (uint)(0 < local_5c);
      if (in == (xmlBufferPtr)0x0) break;
      toconv = in->use;
      if (local_5c <= toconv * 4) {
        xmlBufferGrow(out,toconv * 4);
        uVar4 = (ulong)out->use;
        local_5c = ~out->use + out->size;
      }
      iVar1 = xmlEncOutputChunk(local_50,out->content + uVar4,&local_5c,in->content,&toconv);
      xmlBufferShrink(in,toconv);
      uVar3 = out->use + local_5c;
      out->use = uVar3;
      iVar5 = iVar5 + local_5c;
      out->content[uVar3] = '\0';
      if (iVar1 != -3) {
        if (iVar1 != -2) {
          if (iVar5 == 0) {
            return iVar1;
          }
          return iVar5;
        }
        len = in->use;
        iVar1 = xmlGetUTF8Char(in->content,&len);
        if (iVar1 < 1) {
          return -2;
        }
        iVar1 = xmlSerializeDecCharRef((char *)charref,iVar1);
        xmlBufferShrink(in,len);
        xmlBufferGrow(out,iVar1 * 4);
        local_5c = ~out->use + out->size;
        toconv = iVar1;
        iVar2 = xmlEncOutputChunk(local_50,out->content + out->use,&local_5c,charref,&toconv);
        if ((iVar2 < 0) || (toconv != iVar1)) {
          return -1;
        }
        uVar3 = out->use + local_5c;
        out->use = uVar3;
        iVar5 = iVar5 + local_5c;
        out->content[uVar3] = '\0';
      }
    }
    toconv = 0;
    iVar5 = 0;
    xmlEncOutputChunk(local_50,out->content + uVar4,&local_5c,(uchar *)0x0,&toconv);
    uVar3 = out->use + local_5c;
    out->use = uVar3;
    out->content[uVar3] = '\0';
  }
  return iVar5;
}

Assistant:

int
xmlCharEncOutFunc(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                  xmlBufferPtr in) {
    int ret;
    int written;
    int writtentot = 0;
    int toconv;

    if (handler == NULL) return(XML_ENC_ERR_INTERNAL);
    if (out == NULL) return(XML_ENC_ERR_INTERNAL);

retry:

    written = out->size - out->use;

    if (written > 0)
	written--; /* Gennady: count '/0' */

    /*
     * First specific handling of in = NULL, i.e. the initialization call
     */
    if (in == NULL) {
        toconv = 0;
        /* TODO: Check return value. */
        xmlEncOutputChunk(handler, &out->content[out->use], &written,
                          NULL, &toconv);
        out->use += written;
        out->content[out->use] = 0;
        return(0);
    }

    /*
     * Conversion itself.
     */
    toconv = in->use;
    if (toconv * 4 >= written) {
        xmlBufferGrow(out, toconv * 4);
	written = out->size - out->use - 1;
    }
    ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                            in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    writtentot += written;
    out->content[out->use] = 0;

    if (ret == XML_ENC_ERR_SPACE)
        goto retry;

    /*
     * Attempt to handle error cases
     */
    if (ret == XML_ENC_ERR_INPUT) {
        xmlChar charref[20];
        int len = in->use;
        const xmlChar *utf = (const xmlChar *) in->content;
        int cur, charrefLen;

        cur = xmlGetUTF8Char(utf, &len);
        if (cur <= 0)
            return(ret);

        /*
         * Removes the UTF8 sequence, and replace it by a charref
         * and continue the transcoding phase, hoping the error
         * did not mangle the encoder state.
         */
        charrefLen = xmlSerializeDecCharRef((char *) charref, cur);
        xmlBufferShrink(in, len);
        xmlBufferGrow(out, charrefLen * 4);
        written = out->size - out->use - 1;
        toconv = charrefLen;
        ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                                charref, &toconv);
        if ((ret < 0) || (toconv != charrefLen))
            return(XML_ENC_ERR_INTERNAL);

        out->use += written;
        writtentot += written;
        out->content[out->use] = 0;
        goto retry;
    }
    return(writtentot ? writtentot : ret);
}